

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void udp_pipe_send(void *arg,nni_aio *aio)

{
  nni_msg *m;
  size_t sVar1;
  size_t sVar2;
  size_t local_50;
  size_t count;
  nng_msg *msg;
  undefined4 local_38;
  udp_sp_data dreq;
  udp_ep *ep;
  udp_pipe *p;
  nni_aio *aio_local;
  void *arg_local;
  
  local_50 = 0;
  m = nni_aio_get_msg(aio);
  dreq._12_8_ = *arg;
  if (m != (nni_msg *)0x0) {
    local_50 = nni_msg_len(m);
    sVar1 = nni_msg_header_len(m);
    local_50 = local_50 + sVar1;
  }
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)(dreq._12_8_ + 8));
  sVar1 = nni_msg_len(m);
  sVar2 = nni_msg_header_len(m);
  if ((ulong)*(ushort *)((long)arg + 0xac) < sVar1 + sVar2) {
    nni_mtx_unlock((nni_mtx *)(dreq._12_8_ + 8));
    nni_aio_finish(aio,NNG_OK,local_50);
    nni_stat_inc((nni_stat_item *)(dreq._12_8_ + 0xc38),1);
    nni_msg_free(m);
  }
  else {
    msg._4_1_ = 1;
    msg._6_2_ = *(undefined2 *)(dreq._12_8_ + 0x30);
    msg._5_1_ = 0;
    local_38 = *(undefined4 *)((long)arg + 0x9c);
    dreq._0_4_ = *(undefined4 *)((long)arg + 0xa0);
    dreq.us_sender_id = *(uint32_t *)((long)arg + 0xa4);
    *(uint32_t *)((long)arg + 0xa4) = dreq.us_sender_id + 1;
    dreq.us_peer_id._0_2_ = (undefined2)local_50;
    udp_queue_tx((udp_ep *)dreq._12_8_,(nng_sockaddr *)((long)arg + 0x10),
                 (udp_sp_msg *)((long)&msg + 4),m);
    nni_mtx_unlock((nni_mtx *)(dreq._12_8_ + 8));
    nni_aio_finish(aio,NNG_OK,local_50);
  }
  return;
}

Assistant:

static void
udp_pipe_send(void *arg, nni_aio *aio)
{
	udp_pipe   *p = arg;
	udp_ep     *ep;
	udp_sp_data dreq;
	nng_msg    *msg;
	size_t      count = 0;

	msg = nni_aio_get_msg(aio);
	ep  = p->ep;

	if (msg != NULL) {
		count = nni_msg_len(msg) + nni_msg_header_len(msg);
	}

	nni_aio_reset(aio);
	nni_mtx_lock(&ep->mtx);
	if ((nni_msg_len(msg) + nni_msg_header_len(msg)) > p->sndmax) {
		nni_mtx_unlock(&ep->mtx);
		// rather failing this with an error, we just drop it on the
		// floor. this is on the sender, so there isn't a compelling
		// need to disconnect the pipe, since it we're not being
		// "ill-behaved" to our peer.
		nni_aio_finish(aio, 0, count);
		nni_stat_inc(&ep->st_snd_toobig, 1);
		nni_msg_free(msg);
		return;
	}

	dreq.us_ver       = 1;
	dreq.us_type      = ep->proto;
	dreq.us_op_code   = OPCODE_DATA;
	dreq.us_sender_id = p->self_id;
	dreq.us_peer_id   = p->peer_id;
	dreq.us_sequence  = p->self_seq++;
	dreq.us_length    = (uint16_t) count;

	// Just queue it, or fail it.
	udp_queue_tx(ep, &p->peer_addr, (void *) &dreq, msg);
	nni_mtx_unlock(&ep->mtx);

	nni_aio_finish(aio, 0, count);
}